

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void DumpString(TString *s,DumpState *D)

{
  ulong local_30;
  char *str;
  size_t size;
  DumpState *D_local;
  TString *s_local;
  
  size = (size_t)D;
  D_local = (DumpState *)s;
  if (s == (TString *)0x0) {
    DumpByte(0,D);
  }
  else {
    if (s->tt == '\x04') {
      local_30 = (ulong)s->shrlen;
    }
    else {
      local_30 = (s->u).lnglen;
    }
    str = (char *)(local_30 + 1);
    if (str < (char *)0xff) {
      DumpByte((int)str,D);
    }
    else {
      DumpByte(0xff,D);
      DumpBlock(&str,8,(DumpState *)size);
    }
    DumpBlock(s + 1,(size_t)(str + -1),(DumpState *)size);
  }
  return;
}

Assistant:

static void DumpString (const TString *s, DumpState *D) {
  if (s == NULL)
    DumpByte(0, D);
  else {
    size_t size = tsslen(s) + 1;  /* include trailing '\0' */
    const char *str = getstr(s);
    if (size < 0xFF)
      DumpByte(cast_int(size), D);
    else {
      DumpByte(0xFF, D);
      DumpVar(size, D);
    }
    DumpVector(str, size - 1, D);  /* no need to save '\0' */
  }
}